

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  pointer pcVar1;
  pointer pbVar2;
  cmCTest *this_00;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ostream *poVar5;
  pointer fileOrDir;
  string dir;
  string packageGlob;
  Glob gl;
  ostringstream cmCTestLog_msg;
  string local_260;
  string local_240;
  long *local_220;
  long local_210 [2];
  Glob local_200;
  undefined1 local_1a8 [376];
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  pcVar1 = (baseDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar1,pcVar1 + baseDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_240);
  std::__cxx11::string::_M_append((char *)&local_240,(ulong)(fileName->_M_dataplus)._M_p);
  cmsys::Glob::Glob(&local_200);
  local_200.Recurse = true;
  local_200.RecurseThroughSymlinks = true;
  cmsys::Glob::FindFiles(&local_200,&local_240,(GlobMessages *)0x0);
  pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_(&local_200);
  fileOrDir = (pvVar4->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar4->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (fileOrDir != pbVar2) {
    do {
      cmsys::SystemTools::GetParentDirectory(&local_260,fileOrDir);
      bVar3 = cmsys::SystemTools::StringEndsWith(&local_260,(this->PackageName)._M_dataplus._M_p);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Found package directory for ",0x1c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(fileName->_M_dataplus)._M_p,
                            fileName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        this_00 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,(char *)local_220,this->Coverage->Quiet);
        if (local_220 != local_210) {
          operator_delete(local_220,local_210[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        std::__cxx11::string::_M_assign((string *)&this->PackagePath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
        goto LAB_00187613;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      fileOrDir = fileOrDir + 1;
    } while (fileOrDir != pbVar2);
  }
  bVar3 = false;
LAB_00187613:
  cmsys::Glob::~Glob(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = baseDir;
    packageGlob += "/";
    packageGlob += fileName;
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmsys::SystemTools::StringEndsWith(dir, this->PackageName.c_str())) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }